

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTCTE.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TessellationShaderTCTEgl_in::iterate(TessellationShaderTCTEgl_in *this)

{
  char *__s;
  int iVar1;
  deUint32 dVar2;
  RenderContext *pRVar3;
  undefined4 extraout_var;
  TestLog *pTVar4;
  MessageBuilder *pMVar5;
  TestError *pTVar6;
  float fVar7;
  char *local_3d0;
  MessageBuilder local_3c8;
  GLchar **local_248;
  GLint *rendered_value_1;
  MessageBuilder local_238;
  GLchar **local_b8;
  GLfloat *rendered_value;
  undefined4 local_a8;
  uint n_component;
  float epsilon;
  _xfb_varying_type varying_type;
  uint n_varying_components;
  allocator<char> local_89;
  string local_88 [8];
  string name;
  GLint expected_value_int [4];
  GLfloat expected_value_float [4];
  GLint n_xfb_name;
  GLint n_point;
  uchar *traveller_ptr;
  GLchar **ppGStack_30;
  GLint xfb_size;
  GLchar **xfb_names;
  void *rendered_data;
  long lStack_18;
  GLint n_xfb_names;
  Functions *gl;
  TessellationShaderTCTEgl_in *this_local;
  
  gl = (Functions *)this;
  initTest(this);
  pRVar3 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar1 = (*pRVar3->_vptr_RenderContext[3])();
  lStack_18 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lStack_18 + 0xfd8))((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,1);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"glPatchParameteriEXT() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x62a);
  (**(code **)(lStack_18 + 0x1680))(this->m_po_id);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"glUseProgram() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x630);
  (**(code **)(lStack_18 + 0x5e0))(0x8c89);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"glEnable(GL_RASTERIZER_DISCARD) call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x633);
  (**(code **)(lStack_18 + 0x30))(0);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"glBeginTransformFeedback(GL_POINTS) call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x636);
  (**(code **)(lStack_18 + 0x538))((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,1);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"glDrawArrays() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x63a);
  (**(code **)(lStack_18 + 0x638))();
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"glEndTransformFeedback() call failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x63d);
  rendered_data._4_4_ = 0;
  xfb_names = (GLchar **)0x0;
  ppGStack_30 = (GLchar **)0x0;
  traveller_ptr._4_4_ = 0;
  getXFBProperties(this,&stack0xffffffffffffffd0,(GLint *)((long)&rendered_data + 4),
                   (GLint *)((long)&traveller_ptr + 4));
  xfb_names = (GLchar **)(**(code **)(lStack_18 + 0xd00))(0x8c8e,0,(long)traveller_ptr._4_4_,1);
  dVar2 = (**(code **)(lStack_18 + 0x800))();
  glu::checkError(dVar2,"glMapBufferRange() call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                  ,0x648);
  _n_xfb_name = xfb_names;
  expected_value_float[3] = 0.0;
  do {
    if (1 < (int)expected_value_float[3]) {
      (**(code **)(lStack_18 + 0x1670))(0x8c8e);
      dVar2 = (**(code **)(lStack_18 + 0x800))();
      glu::checkError(dVar2,"glUnmapBuffer() call failed.",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                      ,0x6e7);
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    for (expected_value_float[2] = 0.0; (int)expected_value_float[2] < rendered_data._4_4_;
        expected_value_float[2] = (GLfloat)((int)expected_value_float[2] + 1)) {
      expected_value_int[2] = 0;
      expected_value_int[3] = 0;
      name.field_2._8_8_ = 0;
      expected_value_int[0] = 0;
      expected_value_int[1] = 0;
      __s = ppGStack_30[(int)expected_value_float[2]];
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_88,__s,&local_89);
      std::allocator<char>::~allocator(&local_89);
      epsilon = 0.0;
      n_component = 2;
      iVar1 = std::__cxx11::string::compare((char *)local_88);
      if (iVar1 == 0) {
        expected_value_int[2] = 0x41b00000;
        epsilon = 1.4013e-45;
        n_component = 0;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)local_88);
        if (iVar1 == 0) {
          name.field_2._8_4_ = 0x17;
          epsilon = 1.4013e-45;
          n_component = 1;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)local_88);
          if (iVar1 == 0) {
            name.field_2._8_8_ = 0x1900000018;
            expected_value_int[0] = 0x1a;
            epsilon = 4.2039e-45;
            n_component = 1;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)local_88);
            if (iVar1 == 0) {
              expected_value_int[2] = 0x41d80000;
              expected_value_int[3] = 0x41e00000;
              epsilon = 5.60519e-45;
              n_component = 0;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)local_88);
              if (iVar1 == 0) {
                name.field_2._8_4_ = 0x26;
                epsilon = 1.4013e-45;
                n_component = 1;
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)local_88);
                if (iVar1 == 0) {
                  expected_value_int[2] = 0x421c0000;
                  epsilon = 1.4013e-45;
                  n_component = 0;
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)local_88);
                  if (iVar1 == 0) {
                    name.field_2._8_4_ = 0x1f;
                    epsilon = 1.4013e-45;
                    n_component = 1;
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)local_88);
                    if (iVar1 == 0) {
                      name.field_2._8_8_ = 0x2100000020;
                      epsilon = 2.8026e-45;
                      n_component = 1;
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)local_88);
                      if (iVar1 == 0) {
                        expected_value_int[2] = 0x42080000;
                        expected_value_int[3] = 0x420c0000;
                      }
                      else {
                        iVar1 = std::__cxx11::string::compare((char *)local_88);
                        if (iVar1 != 0) {
                          pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
                          tcu::TestError::TestError
                                    (pTVar6,"Unrecognized XFB name",(char *)0x0,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                                     ,0x6ab);
                          __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
                        }
                        expected_value_int[2] = 0x40a00000;
                        expected_value_int[3] = 0x40c00000;
                      }
                      epsilon = 5.60519e-45;
                      n_component = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
      local_a8 = 0x3727c5ac;
      for (rendered_value._4_4_ = 0.0; (uint)rendered_value._4_4_ < (uint)epsilon;
          rendered_value._4_4_ = (float)((int)rendered_value._4_4_ + 1)) {
        if (n_component == 0) {
          local_b8 = _n_xfb_name;
          fVar7 = de::abs<float>(*(float *)_n_xfb_name -
                                 (float)expected_value_int[(ulong)(uint)rendered_value._4_4_ + 2]);
          if (1e-05 < fVar7) {
            pTVar4 = tcu::TestContext::getLog
                               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_238,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar5 = tcu::MessageBuilder::operator<<
                               (&local_238,(char (*) [29])"Invalid component at index [");
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)((long)&rendered_value + 4));
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a1cf32);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [8])"(found:");
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(float *)local_b8);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])0x2ae0deb);
            pMVar5 = tcu::MessageBuilder::operator<<
                               (pMVar5,(float *)(expected_value_int +
                                                (ulong)(uint)rendered_value._4_4_ + 2));
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])") for varying [");
            rendered_value_1 = (GLint *)std::__cxx11::string::c_str();
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char **)&rendered_value_1);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x29ea7ce);
            tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_238);
          }
        }
        else {
          if (n_component != 1) {
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar6,"Unrecognized varying type",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                       ,0x6dd);
            __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
          local_248 = _n_xfb_name;
          if (*(float *)_n_xfb_name !=
              (float)expected_value_int[(ulong)(uint)rendered_value._4_4_ - 2]) {
            pTVar4 = tcu::TestContext::getLog
                               ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
            tcu::TestLog::operator<<(&local_3c8,pTVar4,(BeginMessageToken *)&tcu::TestLog::Message);
            pMVar5 = tcu::MessageBuilder::operator<<
                               (&local_3c8,(char (*) [29])"Invalid component at index [");
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(uint *)((long)&rendered_value + 4));
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0x2a1cf32);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [8])"(found:");
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)local_248);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [11])0x2ae0deb);
            pMVar5 = tcu::MessageBuilder::operator<<
                               (pMVar5,expected_value_int + ((ulong)(uint)rendered_value._4_4_ - 2))
            ;
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [16])") for varying [");
            local_3d0 = (char *)std::__cxx11::string::c_str();
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&local_3d0);
            pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0x29ea7ce);
            tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
            tcu::MessageBuilder::~MessageBuilder(&local_3c8);
            pTVar6 = (TestError *)__cxa_allocate_exception(0x38);
            tcu::TestError::TestError
                      (pTVar6,"Invalid rendered value",(char *)0x0,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTCTE.cpp"
                       ,0x6d3);
            __cxa_throw(pTVar6,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
          }
        }
        _n_xfb_name = (GLchar **)((long)_n_xfb_name + 4);
      }
      std::__cxx11::string::~string(local_88);
    }
    expected_value_float[3] = (GLfloat)((int)expected_value_float[3] + 1);
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTCTEgl_in::iterate(void)
{
	/* Initialize ES test objects */
	initTest();

	/* Our program object takes a single vertex per patch */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() call failed");

	/* Render the geometry. We're only interested in XFB data, not the visual outcome,
	 * so disable rasterization before we fire a draw call.
	 */
	gl.useProgram(m_po_id);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() call failed");

	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) call failed");

	gl.beginTransformFeedback(GL_POINTS);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback(GL_POINTS) call failed");
	{
		gl.drawArrays(m_glExtTokens.PATCHES, 0 /* first */, 1 /* count */);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() call failed");
	}
	gl.endTransformFeedback();
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() call failed");

	/* Download the data we stored with TF */
	glw::GLint			n_xfb_names   = 0;
	void*				rendered_data = NULL;
	const glw::GLchar** xfb_names	 = NULL;
	glw::GLint			xfb_size	  = 0;

	getXFBProperties(&xfb_names, &n_xfb_names, &xfb_size);

	rendered_data = gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* offset */, xfb_size, GL_MAP_READ_BIT);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() call failed.");

	/* Move through the result buffer and make sure the values we retrieved are valid.
	 * Note that two points will be generated by the tessellator, so run the checks
	 * twice.
	 */
	typedef enum {
		XFB_VARYING_TYPE_FLOAT,
		XFB_VARYING_TYPE_INT,

		XFB_VARYING_TYPE_UNKNOWN
	} _xfb_varying_type;

	unsigned char* traveller_ptr = (unsigned char*)rendered_data;

	for (glw::GLint n_point = 0; n_point < 2 /* points */; ++n_point)
	{
		for (glw::GLint n_xfb_name = 0; n_xfb_name < n_xfb_names; ++n_xfb_name)
		{
			glw::GLfloat	  expected_value_float[4] = { 0.0f };
			glw::GLint		  expected_value_int[4]   = { 0 };
			std::string		  name					  = xfb_names[n_xfb_name];
			unsigned int	  n_varying_components	= 0;
			_xfb_varying_type varying_type			  = XFB_VARYING_TYPE_UNKNOWN;

			if (name.compare("result_float") == 0)
			{
				expected_value_float[0] = 22.0f;
				n_varying_components	= 1;
				varying_type			= XFB_VARYING_TYPE_FLOAT;
			}
			else if (name.compare("result_int") == 0)
			{
				expected_value_int[0] = 23;
				n_varying_components  = 1;
				varying_type		  = XFB_VARYING_TYPE_INT;
			}
			else if (name.compare("result_ivec3") == 0)
			{
				expected_value_int[0] = 24;
				expected_value_int[1] = 25;
				expected_value_int[2] = 26;
				n_varying_components  = 3;
				varying_type		  = XFB_VARYING_TYPE_INT;
			}
			else if (name.compare("result_mat2") == 0)
			{
				expected_value_float[0] = 27.0f;
				expected_value_float[1] = 28.0f;
				expected_value_float[2] = 29.0f;
				expected_value_float[3] = 30.0f;
				n_varying_components	= 4;
				varying_type			= XFB_VARYING_TYPE_FLOAT;
			}
			else if (name.compare("result_struct_test1") == 0)
			{
				expected_value_int[0] = 38;
				n_varying_components  = 1;
				varying_type		  = XFB_VARYING_TYPE_INT;
			}
			else if (name.compare("result_struct_test2") == 0)
			{
				expected_value_float[0] = 39.0f;
				n_varying_components	= 1;
				varying_type			= XFB_VARYING_TYPE_FLOAT;
			}
			else if (name.compare("result_uint") == 0)
			{
				expected_value_int[0] = 31;
				n_varying_components  = 1;
				varying_type		  = XFB_VARYING_TYPE_INT;
			}
			else if (name.compare("result_uvec2") == 0)
			{
				expected_value_int[0] = 32;
				expected_value_int[1] = 33;
				n_varying_components  = 2;
				varying_type		  = XFB_VARYING_TYPE_INT;
			}
			else if (name.compare("result_vec4") == 0)
			{
				expected_value_float[0] = 34.0f;
				expected_value_float[1] = 35.0f;
				expected_value_float[2] = 36.0f;
				expected_value_float[3] = 37.0f;
				n_varying_components	= 4;
				varying_type			= XFB_VARYING_TYPE_FLOAT;
			}
			else if (name.compare("gl_Position") == 0)
			{
				expected_value_float[0] = 5.0f;
				expected_value_float[1] = 6.0f;
				expected_value_float[2] = 7.0f;
				expected_value_float[3] = 8.0f;
				n_varying_components	= 4;
				varying_type			= XFB_VARYING_TYPE_FLOAT;
			}
			else
			{
				TCU_FAIL("Unrecognized XFB name");
			}

			/* Move through the requested amount of components and perform type-specific
			 * comparison.
			 */
			const float epsilon = (float)1e-5;

			for (unsigned int n_component = 0; n_component < n_varying_components; ++n_component)
			{
				switch (varying_type)
				{
				case XFB_VARYING_TYPE_FLOAT:
				{
					glw::GLfloat* rendered_value = (glw::GLfloat*)traveller_ptr;

					if (de::abs(*rendered_value - expected_value_float[n_component]) > epsilon)
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message << "Invalid component at index [" << n_component << "] "
							<< "(found:" << *rendered_value << " expected:" << expected_value_float[n_component]
							<< ") for varying [" << name.c_str() << "]" << tcu::TestLog::EndMessage;
					}

					traveller_ptr += sizeof(glw::GLfloat);

					break;
				}

				case XFB_VARYING_TYPE_INT:
				{
					glw::GLint* rendered_value = (glw::GLint*)traveller_ptr;

					if (*rendered_value != expected_value_int[n_component])
					{
						m_testCtx.getLog()
							<< tcu::TestLog::Message << "Invalid component at index [" << n_component << "] "
							<< "(found:" << *rendered_value << " expected:" << expected_value_int[n_component]
							<< ") for varying [" << name.c_str() << "]" << tcu::TestLog::EndMessage;

						TCU_FAIL("Invalid rendered value");
					}

					traveller_ptr += sizeof(glw::GLint);

					break;
				}

				default:
				{
					TCU_FAIL("Unrecognized varying type");
				}
				} /* switch(varying_type) */

			} /* for (all components) */
		}	 /* for (all XFBed variables) */
	}		  /* for (both points) */

	/* Unmap the BO */
	gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() call failed.");

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}